

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O0

void protect_create(refs_table_t *tbl,size_t _refs_size)

{
  FILE *__stream;
  uint64_t *puVar1;
  int *piVar2;
  char *pcVar3;
  size_t _refs_size_local;
  refs_table_t *tbl_local;
  
  if ((int)POPCOUNT(_refs_size) != 1) {
    fprintf(_stderr,"refs: Table size must be a power of 2!\n");
    exit(1);
  }
  tbl->refs_size = _refs_size;
  puVar1 = (uint64_t *)alloc_aligned(tbl->refs_size << 3);
  tbl->refs_table = puVar1;
  __stream = _stderr;
  if (tbl->refs_table == (uint64_t *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(__stream,"refs: Unable to allocate memory: %s!\n",pcVar3);
    exit(1);
  }
  return;
}

Assistant:

void
protect_create(refs_table_t *tbl, size_t _refs_size)
{
    if (__builtin_popcountll(_refs_size) != 1) {
        fprintf(stderr, "refs: Table size must be a power of 2!\n");
        exit(1);
    }

    tbl->refs_size = _refs_size;
    tbl->refs_table = (_Atomic(uint64_t)*)alloc_aligned(tbl->refs_size * sizeof(uint64_t));
    if (tbl->refs_table == 0) {
        fprintf(stderr, "refs: Unable to allocate memory: %s!\n", strerror(errno));
        exit(1);
    }
}